

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

shared_ptr<pbrt::syntactic::Texture> __thiscall
pbrt::syntactic::Attributes::findNamedTexture(Attributes *this,string *name)

{
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<pbrt::syntactic::Texture> sVar1;
  string *in_stack_00000028;
  shared_ptr<pbrt::syntactic::Texture> *in_stack_00000030;
  Attributes *in_stack_00000038;
  string local_48 [72];
  
  std::shared_ptr<pbrt::syntactic::Texture>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Texture> *)0x1beca8);
  std::__cxx11::string::string(local_48,in_RDX);
  findNamedItem<std::shared_ptr<pbrt::syntactic::Texture>>
            (in_stack_00000038,in_stack_00000030,in_stack_00000028);
  std::__cxx11::string::~string(local_48);
  std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::Texture> *)0x1bece7);
  sVar1.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<pbrt::syntactic::Texture>)
         sVar1.super___shared_ptr<pbrt::syntactic::Texture,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Texture> findNamedTexture(std::string name) {
        return findNamedItem(std::shared_ptr<Texture>{}, name);
      }